

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::AddressFormatData::AddressFormatData(AddressFormatData *this,string *default_format_name)

{
  bool bVar1;
  string *default_format_name_local;
  AddressFormatData *this_local;
  
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->map_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->map_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->map_);
  bVar1 = ::std::operator==(default_format_name,"mainnet");
  if (bVar1) {
    ::std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const*const&,char_const*const&>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,&kNettype,(char **)&kNettypeMainnet);
    ::std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const*const&,char_const(&)[3]>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,&kPrefixP2pkh,(char (*) [3])0x73e286);
    ::std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const*const&,char_const(&)[3]>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,(char **)&kPrefixP2sh,(char (*) [3])0x7168e5);
    ::std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const*const&,char_const(&)[3]>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,&kPrefixBech32Hrp,(char (*) [3])0x70e2a4);
  }
  else {
    bVar1 = ::std::operator==(default_format_name,"testnet");
    if (bVar1) {
      ::std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const*const&,char_const*const&>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this,&kNettype,(char **)&kNettypeTestnet);
      ::std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const*const&,char_const(&)[3]>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this,&kPrefixP2pkh,(char (*) [3])"6f");
      ::std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const*const&,char_const(&)[3]>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this,(char **)&kPrefixP2sh,(char (*) [3])0x6df73d);
      ::std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const*const&,char_const(&)[3]>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this,&kPrefixBech32Hrp,(char (*) [3])"tb");
    }
    else {
      bVar1 = ::std::operator==(default_format_name,"regtest");
      if (bVar1) {
        ::std::
        map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const*const&,char_const*const&>
                  ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kNettype,(char **)&kNettypeRegtest);
        ::std::
        map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const*const&,char_const(&)[3]>
                  ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixP2pkh,(char (*) [3])"6f");
        ::std::
        map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const*const&,char_const(&)[3]>
                  ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,(char **)&kPrefixP2sh,(char (*) [3])0x6df73d);
        ::std::
        map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const*const&,char_const(&)[5]>
                  ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixBech32Hrp,(char (*) [5])"bcrt");
      }
      else {
        bVar1 = ::std::operator==(default_format_name,"liquidv1");
        if (bVar1) {
          ::std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<char_const*const&,char_const*const&>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this,&kNettype,&kNettypeLiquidV1);
          ::std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<char_const*const&,char_const(&)[3]>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this,&kPrefixP2pkh,(char (*) [3])0x6fc3a2);
          ::std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<char_const*const&,char_const(&)[3]>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this,(char **)&kPrefixP2sh,(char (*) [3])0x73ba08);
          ::std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<char_const*const&,char_const(&)[3]>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this,&kPrefixBech32Hrp,(char (*) [3])0x68713f);
          ::std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<char_const*const&,char_const(&)[3]>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this,&kPrefixBlindP2pkh,(char (*) [3])0x6a4e09);
          ::std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<char_const*const&,char_const(&)[3]>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this,&kPrefixBlindP2sh,(char (*) [3])0x6a4e09);
          ::std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<char_const*const&,char_const(&)[3]>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this,&kPrefixBlindBech32Hrp,(char (*) [3])"lq");
        }
        else {
          bVar1 = ::std::operator==(default_format_name,"elementsregtest");
          if (bVar1) {
            ::std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<char_const*const&,char_const*const&>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this,&kNettype,&kNettypeElementsRegtest);
            ::std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<char_const*const&,char_const(&)[3]>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this,&kPrefixP2pkh,(char (*) [3])0x68f7f5);
            ::std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<char_const*const&,char_const(&)[3]>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this,(char **)&kPrefixP2sh,(char (*) [3])"4b");
            ::std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<char_const*const&,char_const(&)[4]>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this,&kPrefixBech32Hrp,(char (*) [4])0x68d339);
            ::std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<char_const*const&,char_const(&)[3]>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this,&kPrefixBlindP2pkh,(char (*) [3])0x73bbd6);
            ::std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<char_const*const&,char_const(&)[3]>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this,&kPrefixBlindP2sh,(char (*) [3])0x73bbd6);
            ::std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<char_const*const&,char_const(&)[3]>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this,&kPrefixBlindBech32Hrp,(char (*) [3])0x68e1a6);
          }
        }
      }
    }
  }
  return;
}

Assistant:

AddressFormatData::AddressFormatData(const std::string& default_format_name)
    : map_() {
  if (default_format_name == kNettypeMainnet) {
    map_.emplace(kNettype, kNettypeMainnet);
    map_.emplace(kPrefixP2pkh, "00");
    map_.emplace(kPrefixP2sh, "05");
    map_.emplace(kPrefixBech32Hrp, "bc");
  } else if (default_format_name == kNettypeTestnet) {
    map_.emplace(kNettype, kNettypeTestnet);
    map_.emplace(kPrefixP2pkh, "6f");
    map_.emplace(kPrefixP2sh, "c4");
    map_.emplace(kPrefixBech32Hrp, "tb");
  } else if (default_format_name == kNettypeRegtest) {
    map_.emplace(kNettype, kNettypeRegtest);
    map_.emplace(kPrefixP2pkh, "6f");
    map_.emplace(kPrefixP2sh, "c4");
    map_.emplace(kPrefixBech32Hrp, "bcrt");
  } else {
#ifndef CFD_DISABLE_ELEMENTS
    if (default_format_name == kNettypeLiquidV1) {
      map_.emplace(kNettype, kNettypeLiquidV1);
      map_.emplace(kPrefixP2pkh, "39");
      map_.emplace(kPrefixP2sh, "27");
      map_.emplace(kPrefixBech32Hrp, "ex");
      map_.emplace(kPrefixBlindP2pkh, "0c");
      map_.emplace(kPrefixBlindP2sh, "0c");
      map_.emplace(kPrefixBlindBech32Hrp, "lq");
    } else if (default_format_name == kNettypeElementsRegtest) {
      map_.emplace(kNettype, kNettypeElementsRegtest);
      map_.emplace(kPrefixP2pkh, "eb");
      map_.emplace(kPrefixP2sh, "4b");
      map_.emplace(kPrefixBech32Hrp, "ert");
      map_.emplace(kPrefixBlindP2pkh, "04");
      map_.emplace(kPrefixBlindP2sh, "04");
      map_.emplace(kPrefixBlindBech32Hrp, "el");
    }
#endif
  }
}